

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_corofile.cpp
# Opt level: O0

void test_random_read_write<(coro_io::execution_type)2>(string_view filename)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string_view filepath;
  ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_> *pEVar1;
  undefined8 in_RSI;
  char *in_RDI;
  string buf2;
  string buf1;
  basic_random_coro_file<(coro_io::execution_type)2> file1;
  pair<std::error_code,_unsigned_long> pair;
  char buf [100];
  basic_random_coro_file<(coro_io::execution_type)2> file;
  basic_random_coro_file<(coro_io::execution_type)2> *in_stack_fffffffffffffc10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffc20;
  ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>
  *in_stack_fffffffffffffc28;
  basic_random_coro_file<(coro_io::execution_type)2> *in_stack_fffffffffffffc30;
  allocator_type *in_stack_fffffffffffffc38;
  ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>
  *in_stack_fffffffffffffc40;
  allocator<char> *__a;
  undefined4 in_stack_fffffffffffffc48;
  undefined4 uVar2;
  openmode in_stack_fffffffffffffc4c;
  undefined4 uVar3;
  basic_random_coro_file<(coro_io::execution_type)2> *in_stack_fffffffffffffc50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined1 *puVar4;
  Handle *local_390;
  Handle *lazy;
  allocator<char> local_339 [25];
  anon_class_8_1_898ba27a *in_stack_fffffffffffffce0;
  anon_class_8_1_898ba27a *in_stack_fffffffffffffcf0;
  anon_class_16_2_20c0d53e *this_00;
  undefined1 in_stack_fffffffffffffd00 [16];
  allocator<char> local_2e1 [33];
  undefined1 *local_2c0;
  undefined4 local_2b8;
  undefined4 uStack_2b4;
  int iStack_2b0;
  undefined4 uStack_2ac;
  undefined1 local_2a0 [40];
  basic_executor_type<std::allocator<void>,_0UL> in_stack_fffffffffffffd88;
  element_type *in_stack_fffffffffffffd90;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffd98;
  _Alloc_hider in_stack_fffffffffffffda0;
  string_view in_stack_fffffffffffffda8;
  pair<std::error_code,_unsigned_long> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_208;
  pair<std::error_code,_unsigned_long> local_1f8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  pair<std::error_code,_unsigned_long> local_1c8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  undefined1 local_190 [8];
  error_category *in_stack_fffffffffffffe78;
  undefined8 in_stack_fffffffffffffe80;
  undefined1 local_178 [112];
  undefined1 *local_108;
  undefined1 *local_100;
  char *local_f8;
  undefined8 uStack_f0;
  undefined1 local_e0 [106];
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_76;
  undefined1 local_75;
  allocator<char> local_61;
  Lazy<std::pair<std::error_code,_unsigned_long>_> *local_60;
  Handle local_58 [4];
  Handle local_38;
  undefined8 local_30;
  undefined8 local_10;
  undefined8 uStack_8;
  
  local_75 = 1;
  lazy = local_58;
  local_60 = (Lazy<std::pair<std::error_code,_unsigned_long>_> *)lazy;
  local_10 = in_RDI;
  uStack_8 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc50,
             (basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
             (allocator<char> *)in_stack_fffffffffffffc40);
  local_75 = 0;
  local_38.__handle_ = local_58;
  local_30 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x17e7db);
  __l._M_array._4_4_ = in_stack_fffffffffffffc4c;
  __l._M_array._0_4_ = in_stack_fffffffffffffc48;
  __l._M_len = (size_type)in_stack_fffffffffffffc50;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffc40,__l,in_stack_fffffffffffffc38);
  create_files((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffe80,(size_t)in_stack_fffffffffffffe78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffffc20);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_76);
  local_390 = &local_38;
  do {
    local_390 = local_390 + -4;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc10);
    this_00 = in_stack_fffffffffffffd00._0_8_;
  } while (local_390 != local_58);
  std::allocator<char>::~allocator(&local_61);
  local_f8 = local_10;
  uStack_f0 = uStack_8;
  std::thread::hardware_concurrency();
  coro_io::get_global_block_executor<coro_io::io_context_pool>(0);
  puVar4 = local_e0;
  filepath._M_str = (char *)local_390;
  filepath._M_len = (size_t)puVar4;
  coro_io::basic_random_coro_file<(coro_io::execution_type)2>::basic_random_coro_file
            (in_stack_fffffffffffffc50,filepath,in_stack_fffffffffffffc4c,in_stack_fffffffffffffc40)
  ;
  local_100 = puVar4;
  test_random_read_write<(coro_io::execution_type)2>::anon_class_8_1_898ba27a::operator()
            (in_stack_fffffffffffffcf0);
  local_108 = local_e0;
  test_random_read_write<(coro_io::execution_type)2>::anon_class_8_1_898ba27a::operator()
            (in_stack_fffffffffffffcf0);
  coro_io::basic_random_coro_file<(coro_io::execution_type)2>::async_read_at
            ((basic_random_coro_file<(coro_io::execution_type)2> *)in_stack_fffffffffffffda0._M_p,
             (uint64_t)in_stack_fffffffffffffd98._M_pi,(char *)in_stack_fffffffffffffd90,
             in_stack_fffffffffffffd88.target_);
  async_simple::coro::syncAwait<async_simple::coro::Lazy<std::pair<std::error_code,unsigned_long>>>
            ((Lazy<std::pair<std::error_code,_unsigned_long>_> *)lazy);
  async_simple::coro::Lazy<std::pair<std::error_code,_unsigned_long>_>::~Lazy
            ((Lazy<std::pair<std::error_code,_unsigned_long>_> *)0x17e945);
  local_1a8 = local_178;
  local_1a0 = local_190;
  test_random_read_write<(coro_io::execution_type)2>::anon_class_16_2_20c0d53e::operator()(this_00);
  local_1b0 = local_e0;
  test_random_read_write<(coro_io::execution_type)2>::anon_class_8_1_898ba27a::operator()
            (in_stack_fffffffffffffcf0);
  coro_io::basic_random_coro_file<(coro_io::execution_type)2>::async_read_at
            ((basic_random_coro_file<(coro_io::execution_type)2> *)in_stack_fffffffffffffda0._M_p,
             (uint64_t)in_stack_fffffffffffffd98._M_pi,(char *)in_stack_fffffffffffffd90,
             in_stack_fffffffffffffd88.target_);
  async_simple::coro::syncAwait<async_simple::coro::Lazy<std::pair<std::error_code,unsigned_long>>>
            ((Lazy<std::pair<std::error_code,_unsigned_long>_> *)lazy);
  std::pair<std::error_code,_unsigned_long>::operator=
            ((pair<std::error_code,_unsigned_long> *)local_190,&local_1c8);
  async_simple::coro::Lazy<std::pair<std::error_code,_unsigned_long>_>::~Lazy
            ((Lazy<std::pair<std::error_code,_unsigned_long>_> *)0x17e9f6);
  local_1d8 = local_e0;
  test_random_read_write<(coro_io::execution_type)2>::anon_class_8_1_898ba27a::operator()
            (in_stack_fffffffffffffce0);
  local_1e0 = local_190;
  test_random_read_write<(coro_io::execution_type)2>::anon_class_8_1_89900fd8::operator()
            ((anon_class_8_1_89900fd8 *)this_00);
  coro_io::basic_random_coro_file<(coro_io::execution_type)2>::async_read_at
            ((basic_random_coro_file<(coro_io::execution_type)2> *)in_stack_fffffffffffffda0._M_p,
             (uint64_t)in_stack_fffffffffffffd98._M_pi,(char *)in_stack_fffffffffffffd90,
             in_stack_fffffffffffffd88.target_);
  async_simple::coro::syncAwait<async_simple::coro::Lazy<std::pair<std::error_code,unsigned_long>>>
            ((Lazy<std::pair<std::error_code,_unsigned_long>_> *)lazy);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190;
  std::pair<std::error_code,_unsigned_long>::operator=
            ((pair<std::error_code,_unsigned_long> *)this,&local_1f8);
  async_simple::coro::Lazy<std::pair<std::error_code,_unsigned_long>_>::~Lazy
            ((Lazy<std::pair<std::error_code,_unsigned_long>_> *)0x17ea9c);
  local_208 = this;
  test_random_read_write<(coro_io::execution_type)2>::anon_class_8_1_89900fd8::operator()
            ((anon_class_8_1_89900fd8 *)this_00);
  coro_io::basic_random_coro_file<(coro_io::execution_type)2>::async_read_at
            ((basic_random_coro_file<(coro_io::execution_type)2> *)in_stack_fffffffffffffda0._M_p,
             (uint64_t)in_stack_fffffffffffffd98._M_pi,(char *)in_stack_fffffffffffffd90,
             in_stack_fffffffffffffd88.target_);
  async_simple::coro::syncAwait<async_simple::coro::Lazy<std::pair<std::error_code,unsigned_long>>>
            ((Lazy<std::pair<std::error_code,_unsigned_long>_> *)lazy);
  std::pair<std::error_code,_unsigned_long>::operator=
            ((pair<std::error_code,_unsigned_long> *)local_190,&local_220);
  async_simple::coro::Lazy<std::pair<std::error_code,_unsigned_long>_>::~Lazy
            ((Lazy<std::pair<std::error_code,_unsigned_long>_> *)0x17eb1b);
  test_random_read_write<(coro_io::execution_type)2>::anon_class_8_1_898ba27a::operator()
            (in_stack_fffffffffffffce0);
  test_random_read_write<(coro_io::execution_type)2>::anon_class_8_1_89900fd8::operator()
            ((anon_class_8_1_89900fd8 *)this_00);
  std::thread::hardware_concurrency();
  pEVar1 = coro_io::get_global_block_executor<coro_io::io_context_pool>(0);
  uVar2 = SUB84(pEVar1,0);
  uVar3 = (undefined4)((ulong)pEVar1 >> 0x20);
  coro_io::basic_random_coro_file<(coro_io::execution_type)2>::basic_random_coro_file
            (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
  local_2b8 = (undefined4)local_10;
  uStack_2b4 = local_10._4_4_;
  iStack_2b0 = (int)uStack_8;
  uStack_2ac = uStack_8._4_4_;
  coro_io::basic_random_coro_file<(coro_io::execution_type)2>::open
            ((basic_random_coro_file<(coro_io::execution_type)2> *)local_2a0,local_10,(int)uStack_8,
             0x10);
  local_2c0 = local_2a0;
  test_random_read_write<(coro_io::execution_type)2>::anon_class_8_1_a7e8a955::operator()
            ((anon_class_8_1_a7e8a955 *)in_stack_fffffffffffffce0);
  __a = local_2e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)CONCAT44(uVar3,uVar2),__a);
  std::allocator<char>::~allocator(local_2e1);
  std::__cxx11::string::operator_cast_to_basic_string_view
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc10);
  coro_io::basic_random_coro_file<(coro_io::execution_type)2>::async_write_at
            ((basic_random_coro_file<(coro_io::execution_type)2> *)in_stack_fffffffffffffda0._M_p,
             (uint64_t)in_stack_fffffffffffffd98._M_pi,in_stack_fffffffffffffda8);
  async_simple::coro::syncAwait<async_simple::coro::Lazy<std::pair<std::error_code,unsigned_long>>>
            ((Lazy<std::pair<std::error_code,_unsigned_long>_> *)lazy);
  async_simple::coro::Lazy<std::pair<std::error_code,_unsigned_long>_>::~Lazy
            ((Lazy<std::pair<std::error_code,_unsigned_long>_> *)0x17ec79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)CONCAT44(uVar3,uVar2),__a);
  std::allocator<char>::~allocator(local_339);
  std::__cxx11::string::operator_cast_to_basic_string_view
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc10);
  coro_io::basic_random_coro_file<(coro_io::execution_type)2>::async_write_at
            ((basic_random_coro_file<(coro_io::execution_type)2> *)in_stack_fffffffffffffda0._M_p,
             (uint64_t)in_stack_fffffffffffffd98._M_pi,in_stack_fffffffffffffda8);
  async_simple::coro::syncAwait<async_simple::coro::Lazy<std::pair<std::error_code,unsigned_long>>>
            ((Lazy<std::pair<std::error_code,_unsigned_long>_> *)lazy);
  async_simple::coro::Lazy<std::pair<std::error_code,_unsigned_long>_>::~Lazy
            ((Lazy<std::pair<std::error_code,_unsigned_long>_> *)0x17ed20);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc10);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc10);
  coro_io::basic_random_coro_file<(coro_io::execution_type)2>::~basic_random_coro_file
            (in_stack_fffffffffffffc10);
  coro_io::basic_random_coro_file<(coro_io::execution_type)2>::~basic_random_coro_file
            (in_stack_fffffffffffffc10);
  return;
}

Assistant:

void test_random_read_write(std::string_view filename) {
  create_files({std::string(filename)}, 190);
  coro_io::basic_random_coro_file<execute_type> file(filename, std::ios::in);
  CHECK(file.is_open());
#if defined(ENABLE_FILE_IO_URING) || defined(ASIO_WINDOWS)
  if (execute_type == coro_io::execution_type::native_async) {
    CHECK(file.get_execution_type() == coro_io::execution_type::native_async);
  }
#else
  CHECK(file.get_execution_type() == coro_io::execution_type::thread_pool);
#endif

  char buf[100];
  auto pair = async_simple::coro::syncAwait(file.async_read_at(0, buf, 10));
  CHECK(std::string_view(buf, pair.second) == "AAAAAAAAAA");
  CHECK(!file.eof());

  pair = async_simple::coro::syncAwait(file.async_read_at(10, buf, 100));
  CHECK(!file.eof());
  CHECK(pair.second == 100);

  pair = async_simple::coro::syncAwait(file.async_read_at(110, buf, 100));
  CHECK(pair.second == 80);

  // only read size equal 0 is eof.
  pair = async_simple::coro::syncAwait(file.async_read_at(200, buf, 100));
  CHECK(file.eof());
  CHECK(pair.second == 0);

  coro_io::basic_random_coro_file<execute_type> file1;
  file1.open(filename, std::ios::out);
  CHECK(file1.is_open());
  std::string buf1 = "cccccccccc";
  async_simple::coro::syncAwait(file1.async_write_at(0, buf1));

  std::string buf2 = "dddddddddd";
  async_simple::coro::syncAwait(file1.async_write_at(10, buf2));
}